

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall wabt::interp::Thread::DoSimdSwizzle(Thread *this)

{
  uchar uVar1;
  Simd<unsigned_char,_(unsigned_char)__x10_> SVar2;
  byte local_41;
  undefined1 uStack_40;
  undefined1 uStack_3f;
  undefined1 uStack_3e;
  undefined1 uStack_3d;
  undefined1 uStack_3c;
  undefined1 uStack_3b;
  undefined1 uStack_3a;
  u8 i;
  S result;
  Simd<unsigned_char,_(unsigned_char)__x10_> lhs;
  Simd<unsigned_char,_(unsigned_char)__x10_> rhs;
  Thread *this_local;
  
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this);
  SVar2 = Pop<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this);
  result.v[8] = SVar2.v[0];
  result.v[9] = SVar2.v[1];
  result.v[10] = SVar2.v[2];
  result.v[0xb] = SVar2.v[3];
  result.v[0xc] = SVar2.v[4];
  result.v[0xd] = SVar2.v[5];
  result.v[0xe] = SVar2.v[6];
  result.v[0xf] = SVar2.v[7];
  lhs.v[0] = SVar2.v[8];
  lhs.v[1] = SVar2.v[9];
  lhs.v[2] = SVar2.v[10];
  lhs.v[3] = SVar2.v[0xb];
  lhs.v[4] = SVar2.v[0xc];
  lhs.v[5] = SVar2.v[0xd];
  lhs.v[6] = SVar2.v[0xe];
  lhs.v[7] = SVar2.v[0xf];
  for (local_41 = 0; local_41 < 0x10; local_41 = local_41 + 1) {
    if (lhs.v[(ulong)local_41 + 8] < 0x10) {
      uVar1 = result.v[(ulong)lhs.v[(ulong)local_41 + 8] + 8];
    }
    else {
      uVar1 = '\0';
    }
    lhs.v[(ulong)local_41 - 0x18] = uVar1;
  }
  SVar2.v[8] = result.v[0];
  SVar2.v[9] = result.v[1];
  SVar2.v[10] = result.v[2];
  SVar2.v[0xb] = result.v[3];
  SVar2.v[0xc] = result.v[4];
  SVar2.v[0xd] = result.v[5];
  SVar2.v[0xe] = result.v[6];
  SVar2.v[0xf] = result.v[7];
  SVar2.v[0] = uStack_40;
  SVar2.v[1] = uStack_3f;
  SVar2.v[2] = uStack_3e;
  SVar2.v[3] = uStack_3d;
  SVar2.v[4] = uStack_3c;
  SVar2.v[5] = uStack_3b;
  SVar2.v[6] = uStack_3a;
  SVar2.v[7] = i;
  Push<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this,SVar2);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdSwizzle() {
  using S = u8x16;
  auto rhs = Pop<S>();
  auto lhs = Pop<S>();
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result.v[i] = rhs.v[i] < S::lanes ? lhs.v[rhs.v[i]] : 0;
  }
  Push(result);
  return RunResult::Ok;
}